

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

int look_here(int obj_cnt,boolean picked_some)

{
  monst *mon;
  boolean bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  trap *ptVar6;
  size_t sVar7;
  int idx;
  char *pcVar8;
  undefined7 in_register_00000031;
  obj *obj;
  obj *obj_00;
  bool bVar9;
  bool bVar10;
  int size;
  nh_objitem *items;
  char *local_258;
  undefined4 local_24c;
  char *local_248;
  obj *local_240;
  char fbuf [256];
  char fbuf2 [256];
  
  local_24c = (undefined4)CONCAT71(in_register_00000031,picked_some);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b25df;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b25da;
    pcVar8 = "see";
LAB_001b2669:
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b2695;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b2690;
    local_258 = "Things that are here:";
  }
  else {
LAB_001b25da:
    if (ublindf == (obj *)0x0) {
      pcVar8 = "feel";
    }
    else {
LAB_001b25df:
      pcVar8 = "feel";
      if (ublindf->oartifact == '\x1d') {
        pcVar8 = "see";
      }
    }
    if (u.uprops[0x1e].intrinsic == 0) goto LAB_001b2669;
LAB_001b2690:
    if (ublindf == (obj *)0x0) {
      local_258 = "Things that you feel here:";
    }
    else {
LAB_001b2695:
      local_258 = "Things that you feel here:";
      if (ublindf->oartifact == '\x1d') {
        local_258 = "Things that are here:";
      }
    }
  }
  items = (nh_objitem *)0x0;
  size = 10;
  bVar10 = obj_cnt <= iflags.pilesize;
  bVar1 = update_location(bVar10);
  mon = u.ustuck;
  if ((u.ustuck != (monst *)0x0 & u._1052_1_) == 1) {
    pcVar4 = mon_nam(u.ustuck);
    pcVar4 = s_suffix(pcVar4);
    pcVar5 = mbodypart(mon,0x12);
    sprintf(fbuf,"Contents of %s %s",pcVar4,pcVar5);
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b273e;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b2735;
      pcVar4 = "look around";
    }
    else {
LAB_001b2735:
      if (ublindf == (obj *)0x0) {
        pcVar4 = "try";
      }
      else {
LAB_001b273e:
        pcVar4 = "try";
        if (ublindf->oartifact == '\x1d') {
          pcVar4 = "look around";
        }
      }
    }
    pline("You %s to %s what is lying in %s.",pcVar4,pcVar8,fbuf + 0xc);
    obj = mon->minvent;
    if (obj == (obj *)0x0) {
      pline("You %s no objects here.",pcVar8);
    }
    else {
      do {
        if ((obj->otyp == 0x10e) && (bVar1 = will_feel_cockatrice(obj,'\0'), bVar1 != '\0')) {
          if (u.uprops[0x21].intrinsic == 0) {
            pcVar4 = doname_price(obj);
            pline("You %s here %s.",pcVar8,pcVar4);
            goto LAB_001b2c81;
          }
          break;
        }
        obj = obj->nobj;
      } while (obj != (obj *)0x0);
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b2998;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b2993;
      }
      else {
LAB_001b2993:
        if (ublindf != (obj *)0x0) {
LAB_001b2998:
          if (ublindf->oartifact == '\x1d') goto LAB_001b29b2;
        }
        builtin_strncpy(fbuf,"You feel",9);
      }
LAB_001b29b2:
      sVar7 = strlen(fbuf);
      (fbuf + sVar7)[0] = ':';
      (fbuf + sVar7)[1] = '\0';
      display_minventory(mon,2,fbuf);
    }
    goto LAB_001b29d6;
  }
  if (((bVar10) && (ptVar6 = t_at(level,(int)u.ux,(int)u.uy), ptVar6 != (trap *)0x0)) &&
     ((ptVar6->field_0x8 & 0x20) != 0)) {
    pcVar4 = an(defexplain[(ulong)((byte)ptVar6->field_0x8 & 0x1f) + 0x2f]);
    pline("There is %s here.",pcVar4);
  }
  local_240 = level->objects[(int)u.ux][(int)u.uy];
  pcVar4 = dfeature_at((int)u.ux,(int)u.uy,fbuf2);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    iVar3 = strcmp(pcVar4,"pool of water");
    if ((iVar3 == 0) && ((u._1052_1_ & 2) != 0)) {
      pcVar4 = (char *)0x0;
    }
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b2863;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b285e;
  }
  else {
LAB_001b285e:
    if (ublindf != (obj *)0x0) {
LAB_001b2863:
      if (ublindf->oartifact == '\x1d') goto LAB_001b2a91;
    }
    local_248 = pcVar8;
    bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level);
    bVar9 = true;
    if (bVar2 == '\0') {
      bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
      bVar9 = bVar2 != '\0';
    }
    if ((pcVar4 == (char *)0x0) || (iVar3 = strncmp(pcVar4,"altar ",6), iVar3 != 0)) {
      pcVar8 = "floating here";
      if (bVar9) {
        pcVar5 = "";
      }
      else {
        pcVar8 = "lying here on the ";
        pcVar5 = surface((int)u.ux,(int)u.uy);
      }
      pline("You try to feel what is %s%s.",pcVar8,pcVar5);
    }
    else {
      pline("You try to feel what is here.");
    }
    if (!bVar9 && pcVar4 != (char *)0x0) {
      pcVar8 = surface((int)u.ux,(int)u.uy);
      iVar3 = strcmp(pcVar4,pcVar8);
      if (iVar3 == 0) {
        pcVar4 = (char *)0x0;
      }
    }
    pcVar8 = local_248;
    bVar2 = can_reach_floor();
    if (bVar2 == '\0') {
      bVar10 = false;
      pline("But you can\'t reach it!");
      goto LAB_001b2c8a;
    }
  }
LAB_001b2a91:
  if (pcVar4 != (char *)0x0) {
    pcVar5 = an(pcVar4);
    sprintf(fbuf,"There is %s here.",pcVar5);
  }
  if (((local_240 == (obj *)0x0) || (bVar2 = is_lava(level,(int)u.ux,(int)u.uy), bVar2 != '\0')) ||
     ((bVar2 = is_pool(level,(int)u.ux,(int)u.uy), obj = local_240, bVar2 != '\0' &&
      ((u._1052_1_ & 2) == 0)))) {
    if (pcVar4 != (char *)0x0) {
      pline(fbuf);
    }
    read_engr_at((int)u.ux,(int)u.uy);
    if (bVar10) {
      if (u.uprops[0x1e].intrinsic != 0) {
LAB_001b2b15:
        if (ublindf != (obj *)0x0) {
LAB_001b2b1e:
          if ((pcVar4 != (char *)0x0) && (ublindf->oartifact == '\x1d')) goto LAB_001b2c2e;
        }
LAB_001b2c12:
        pline("You %s no objects here.",pcVar8);
        goto LAB_001b2c2e;
      }
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b2b1e;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b2b15;
      if (pcVar4 == (char *)0x0) goto LAB_001b2c12;
    }
    else {
LAB_001b2c2e:
      if (u.uprops[0x1e].intrinsic != 0) goto LAB_001b2c54;
    }
LAB_001b2c32:
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        bVar10 = false;
        goto LAB_001b2c8a;
      }
LAB_001b2c54:
      if (ublindf == (obj *)0x0) goto LAB_001b2c88;
    }
    bVar10 = ublindf->oartifact != '\x1d';
  }
  else {
    if (!bVar10) {
      if (pcVar4 != (char *)0x0) {
        pline(fbuf);
      }
      read_engr_at((int)u.ux,(int)u.uy);
      pcVar8 = "many";
      if (obj_cnt < 0xb) {
        pcVar8 = "several";
      }
      pcVar4 = " more";
      if ((char)local_24c == '\0') {
        pcVar4 = "";
      }
      pline("There are %s%s objects here.",pcVar8,pcVar4);
LAB_001b29d6:
      if (u.uprops[0x1e].intrinsic == 0) goto LAB_001b2c32;
      goto LAB_001b2c54;
    }
    if ((local_240->v).v_nexthere != (obj *)0x0) {
      obj_00 = level->objects[u.ux][u.uy];
      for (obj = obj_00; obj != (obj *)0x0; obj = (obj->v).v_nexthere) {
        if ((obj->otyp == 0x10e) && (bVar2 = will_feel_cockatrice(obj,'\0'), bVar2 != '\0')) {
          if (u.uprops[0x21].intrinsic == 0) {
            pcVar4 = doname_price(obj);
            pline("You %s here %s.",pcVar8,pcVar4);
            goto LAB_001b2c81;
          }
          break;
        }
      }
      items = (nh_objitem *)malloc((long)size * 0x124);
      if (pcVar4 == (char *)0x0) {
        iVar3 = 0;
      }
      else {
        add_objitem(&items,&size,MI_TEXT,0,0,fbuf,(obj *)0x0,'\0');
        add_objitem(&items,&size,MI_TEXT,1,0,"",(obj *)0x0,'\0');
        obj_00 = level->objects[u.ux][u.uy];
        iVar3 = 2;
      }
      if (obj_00 != (obj *)0x0) {
        idx = iVar3;
        do {
          iVar3 = idx + 1;
          pcVar8 = doname(obj_00);
          add_objitem(&items,&size,MI_NORMAL,idx,0,pcVar8,obj_00,'\0');
          obj_00 = (obj_00->v).v_nexthere;
          idx = iVar3;
        } while (obj_00 != (obj *)0x0);
      }
      if (obj_cnt == 0 || bVar1 == '\0') {
        display_objects(items,iVar3,local_258,0,(nh_objresult *)0x0);
      }
      free(items);
      read_engr_at((int)u.ux,(int)u.uy);
      goto LAB_001b29d6;
    }
    if (pcVar4 != (char *)0x0) {
      pline(fbuf);
    }
    read_engr_at((int)u.ux,(int)u.uy);
    pcVar4 = doname_price(obj);
    pline("You %s here %s.",pcVar8,pcVar4);
    if (((obj->otyp != 0x10e) || (bVar1 = will_feel_cockatrice(obj,'\0'), bVar1 == '\0')) ||
       (u.uprops[0x21].intrinsic != 0)) goto LAB_001b29d6;
LAB_001b2c81:
    feel_cockatrice(obj,'\0');
LAB_001b2c88:
    bVar10 = true;
  }
LAB_001b2c8a:
  return (int)bVar10;
}

Assistant:

int look_here(int obj_cnt, /* obj_cnt > 0 implies that autopickup is in progess */
	      boolean picked_some)
{
	struct obj *otmp;
	struct trap *trap;
	const char *verb = Blind ? "feel" : "see";
	const char *dfeature = NULL;
	char fbuf[BUFSZ], fbuf2[BUFSZ];
	boolean skip_objects = (obj_cnt > iflags.pilesize);
	int icount = 0;
	int size = 10;
	struct nh_objitem *items = NULL;
	const char *title = Blind ? "Things that you feel here:" :
				    "Things that are here:";

	/* show the "things that are here" window iff
	 * - the player didn't get the info via update_location -OR-
	 * - it was explicitly requested (obj_cnt == 0) */
	boolean skip_win = update_location(!skip_objects) && obj_cnt;

	if (u.uswallow && u.ustuck) {
	    struct monst *mtmp = u.ustuck;
	    sprintf(fbuf, "Contents of %s %s",
		s_suffix(mon_nam(mtmp)), mbodypart(mtmp, STOMACH));
	    /* Skip "Contents of " by using fbuf index 12 */
	    pline("You %s to %s what is lying in %s.",
		Blind ? "try" : "look around", verb, &fbuf[12]);
	    otmp = mtmp->minvent;
	    if (otmp) {
		for ( ; otmp; otmp = otmp->nobj) {
		    /* If swallower is an animal, it should have become stone but... */
		    if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE))
			break;
		}
		if (otmp && !Stoned) {
		    pline("You %s here %s.", verb, doname_price(otmp));
		    feel_cockatrice(otmp, FALSE);
		    return 1;
		}
		if (Blind) strcpy(fbuf, "You feel");
		strcat(fbuf,":");
		display_minventory(mtmp, MINV_ALL, fbuf);
	    } else {
		pline("You %s no objects here.", verb);
	    }
	    return !!Blind;
	}
	if (!skip_objects && (trap = t_at(level, u.ux, u.uy)) && trap->tseen)
		pline("There is %s here.",
			an(trapexplain[trap->ttyp - 1]));

	otmp = level->objects[u.ux][u.uy];
	dfeature = dfeature_at(u.ux, u.uy, fbuf2);
	if (dfeature && !strcmp(dfeature, "pool of water") && Underwater)
		dfeature = NULL;

	if (Blind) {
		boolean drift = Is_airlevel(&u.uz) || Is_waterlevel(&u.uz);
		if (dfeature && !strncmp(dfeature, "altar ", 6)) {
		    /* don't say "altar" twice, dfeature has more info */
		    pline("You try to feel what is here.");
		} else {
		    pline("You try to feel what is %s%s.",
			drift ? "floating here" : "lying here on the ",
			drift ? ""		: surface(u.ux, u.uy));
		}
		if (dfeature && !drift && !strcmp(dfeature, surface(u.ux,u.uy)))
			dfeature = NULL;	/* ice already identifed */
		if (!can_reach_floor()) {
			pline("But you can't reach it!");
			return 0;
		}
	}

	if (dfeature)
		sprintf(fbuf, "There is %s here.", an(dfeature));

	if (!otmp || is_lava(level, u.ux, u.uy) || (is_pool(level, u.ux, u.uy) && !Underwater)) {
		if (dfeature) pline(fbuf);
		read_engr_at(u.ux, u.uy);
		if (!skip_objects && (Blind || !dfeature))
		    pline("You %s no objects here.", verb);
		return !!Blind;
	}
	/* we know there is something here */

	if (skip_objects) {
	    if (dfeature) pline(fbuf);
	    read_engr_at(u.ux, u.uy);
	    pline("There are %s%s objects here.",
		  (obj_cnt <= 10) ? "several" : "many",
		  picked_some ? " more" : "");

	} else if (!otmp->nexthere) {
	    /* only one object */
	    if (dfeature) pline(fbuf);
	    read_engr_at(u.ux, u.uy);
#ifdef INVISIBLE_OBJECTS
	    if (otmp->oinvis && !See_invisible) verb = "feel";
#endif
	    pline("You %s here %s.", verb, doname_price(otmp));
	    if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE) && !Stoned) {
		feel_cockatrice(otmp, FALSE);
		return 1;
	    }

	} else {
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE))
		    break;
	    }
	    if (otmp && !Stoned) {
		pline("You %s here %s.", verb, doname_price(otmp));
		feel_cockatrice(otmp, FALSE);
		return 1;
	    }

	    items = malloc(size * sizeof(struct nh_objitem));
	    if (dfeature) {
		add_objitem(&items, &size, MI_TEXT, icount++, 0, fbuf, NULL, FALSE);
		add_objitem(&items, &size, MI_TEXT, icount++, 0, "", NULL, FALSE);
	    }

	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		add_objitem(&items, &size, MI_NORMAL, icount++, 0,
			    doname(otmp), otmp, FALSE);
	    }

	    if (!skip_win)
		display_objects(items, icount, title, PICK_NONE, NULL);
	    free(items);

	    read_engr_at(u.ux, u.uy);
	}
	return !!Blind;
}